

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void * stb__arr_copy_(void *p,int elem_size)

{
  void *__dest;
  stb__arr *q;
  int elem_size_local;
  void *p_local;
  
  if (p == (void *)0x0) {
    p_local = (void *)0x0;
  }
  else {
    __dest = stb__arr_malloc(elem_size * *(int *)((long)p + -0xc) + 0x10);
    memcpy(__dest,(void *)((long)p + -0x10),(long)(elem_size * *(int *)((long)p + -0x10)) + 0x10);
    *(uint *)((long)__dest + 8) = (uint)(stb__arr_context != (void *)0x0);
    p_local = (void *)((long)__dest + 0x10);
  }
  return p_local;
}

Assistant:

void * stb__arr_copy_(void *p, int elem_size)
{
   stb__arr *q;
   if (p == NULL) return p;
   q = (stb__arr *) stb__arr_malloc(sizeof(*q) + elem_size * stb_arrhead2(p)->limit);
   stb_arr_check2(p);
   memcpy(q, stb_arrhead2(p), sizeof(*q) + elem_size * stb_arrhead2(p)->len);
   q->stb_malloc = !!stb__arr_context;
   return q+1;
}